

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

bool execfile(char *cfgfile,bool msg)

{
  char *pcVar1;
  char *pcVar2;
  char *p;
  char *oldsourcestr;
  char *oldsourcefile;
  char *buf;
  string s;
  bool msg_local;
  char *cfgfile_local;
  
  copystring((char *)&buf,cfgfile,0x104);
  pcVar2 = path((char *)&buf);
  p = loadfile(pcVar2,(int *)0x0,true);
  pcVar1 = sourcestr;
  pcVar2 = sourcefile;
  if (p == (char *)0x0) {
    if (msg) {
      conoutf(4,"could not read \"%s\"",cfgfile);
    }
    cfgfile_local._7_1_ = false;
  }
  else {
    sourcefile = cfgfile;
    sourcestr = p;
    execute(p);
    sourcefile = pcVar2;
    sourcestr = pcVar1;
    if (p != (char *)0x0) {
      operator_delete__(p);
    }
    cfgfile_local._7_1_ = true;
  }
  return cfgfile_local._7_1_;
}

Assistant:

bool execfile(const char *cfgfile, bool msg)
{
    string s;
    copystring(s, cfgfile);
    char *buf = loadfile(path(s), NULL);
    if(!buf)
    {
        if(msg) conoutf(CON_ERROR, "could not read \"%s\"", cfgfile);
        return false;
    }
    const char *oldsourcefile = sourcefile, *oldsourcestr = sourcestr;
    sourcefile = cfgfile;
    sourcestr = buf;
    execute(buf);
    sourcefile = oldsourcefile;
    sourcestr = oldsourcestr;
    delete[] buf;
    return true;
}